

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O0

void __thiscall
slang::analysis::AnalysisScopeVisitor::checkValueUnused
          (AnalysisScopeVisitor *this,ValueSymbol *symbol,DiagCode unusedCode,
          optional<slang::DiagCode> unsetCode,optional<slang::DiagCode> unreadCode)

{
  bool bVar1;
  SyntaxNode *pSVar2;
  type_conflict2 *ptVar3;
  type_conflict2 *ptVar4;
  PortBackref *pPVar5;
  PortSymbol *pPVar6;
  DeclaredType *this_00;
  ExpressionSyntax *pEVar7;
  DiagCode *pDVar8;
  undefined8 in_RCX;
  ValueSymbol *in_RSI;
  Symbol *in_RDI;
  PortBackref *portRef;
  type_conflict2 *lvalue;
  type_conflict2 *rvalue;
  SyntaxNode *syntax;
  AnalysisManager *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  bitmask<slang::analysis::AnalysisFlags> flags;
  bool local_a1;
  AnalysisScopeVisitor *this_01;
  DiagCode in_stack_ffffffffffffff84;
  bitmask<slang::analysis::AnalysisFlags> local_24;
  ValueSymbol *local_20;
  undefined4 local_a;
  undefined2 local_6;
  
  flags.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_a = (undefined4)in_RCX;
  local_6 = (undefined2)((ulong)in_RCX >> 0x20);
  this_01 = *(AnalysisScopeVisitor **)in_RDI;
  local_20 = in_RSI;
  bitmask<slang::analysis::AnalysisFlags>::bitmask(&local_24,CheckUnused);
  bVar1 = AnalysisManager::hasFlag(in_stack_ffffffffffffff48,flags);
  if (((bVar1) &&
      (pSVar2 = ast::Symbol::getSyntax(&local_20->super_Symbol), pSVar2 != (SyntaxNode *)0x0)) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        (&(local_20->super_Symbol).name), !bVar1)) {
    isReferenced((AnalysisScopeVisitor *)in_stack_ffffffffffffff48,(SyntaxNode *)0x7d51be);
    ptVar3 = std::get<0ul,bool,bool>((pair<bool,_bool> *)0x7d51d3);
    ptVar4 = std::get<1ul,bool,bool>((pair<bool,_bool> *)0x7d51e5);
    pPVar5 = ast::ValueSymbol::getFirstPortBackref(local_20);
    if (pPVar5 == (PortBackref *)0x0) {
      if (((*ptVar3 & 1U) == 0) && ((*ptVar4 & 1U) == 0)) {
        addDiag(this_01,in_RDI,in_stack_ffffffffffffff84);
      }
      else if (((*ptVar3 & 1U) == 0) &&
              (bVar1 = std::optional::operator_cast_to_bool((optional<slang::DiagCode> *)0x7d53ca),
              bVar1)) {
        std::optional<slang::DiagCode>::operator*((optional<slang::DiagCode> *)0x7d53ea);
        addDiag(this_01,in_RDI,in_stack_ffffffffffffff84);
      }
      else {
        local_a1 = false;
        if ((*ptVar4 & 1U) == 0) {
          ast::ValueSymbol::getDeclaredType((ValueSymbol *)in_stack_ffffffffffffff48);
          this_00 = not_null<const_slang::ast::DeclaredType_*>::operator->
                              ((not_null<const_slang::ast::DeclaredType_*> *)0x7d5434);
          pEVar7 = ast::DeclaredType::getInitializerSyntax(this_00);
          local_a1 = false;
          if (pEVar7 == (ExpressionSyntax *)0x0) {
            local_a1 = std::optional::operator_cast_to_bool((optional<slang::DiagCode> *)0x7d5458);
          }
        }
        if (local_a1 != false) {
          pDVar8 = std::optional<slang::DiagCode>::operator*((optional<slang::DiagCode> *)0x7d5480);
          addDiag(this_01,in_RDI,*pDVar8);
        }
      }
    }
    else {
      pPVar5 = ast::ValueSymbol::PortBackref::getNextBackreference(pPVar5);
      if (pPVar5 == (PortBackref *)0x0) {
        pPVar6 = not_null<const_slang::ast::PortSymbol_*>::operator->
                           ((not_null<const_slang::ast::PortSymbol_*> *)0x7d5227);
        switch(pPVar6->direction) {
        case In:
          if ((*ptVar3 & 1U) == 0) {
            addDiag(this_01,in_RDI,in_stack_ffffffffffffff84);
          }
          break;
        case Out:
          if ((*ptVar4 & 1U) == 0) {
            addDiag(this_01,in_RDI,in_stack_ffffffffffffff84);
          }
          break;
        case InOut:
          if (((*ptVar3 & 1U) == 0) && ((*ptVar4 & 1U) == 0)) {
            addDiag(this_01,in_RDI,in_stack_ffffffffffffff84);
          }
          else if ((*ptVar3 & 1U) == 0) {
            addDiag(this_01,in_RDI,in_stack_ffffffffffffff84);
          }
          else if ((*ptVar4 & 1U) == 0) {
            addDiag(this_01,in_RDI,in_stack_ffffffffffffff84);
          }
          break;
        case Ref:
          if (((*ptVar3 & 1U) == 0) && ((*ptVar4 & 1U) == 0)) {
            addDiag(this_01,in_RDI,in_stack_ffffffffffffff84);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void checkValueUnused(const ValueSymbol& symbol, DiagCode unusedCode,
                          std::optional<DiagCode> unsetCode, std::optional<DiagCode> unreadCode) {
        if (!manager.hasFlag(AnalysisFlags::CheckUnused))
            return;

        auto syntax = symbol.getSyntax();
        if (!syntax || symbol.name.empty())
            return;

        auto [rvalue, lvalue] = isReferenced(*syntax);

        auto portRef = symbol.getFirstPortBackref();
        if (portRef) {
            // This is a variable or net connected internally to a port.
            // If there is more than one port connection something unusually
            // complicated is going on so don't try to diagnose warnings.
            if (portRef->getNextBackreference())
                return;

            // Otherwise check and warn about the port being unused.
            switch (portRef->port->direction) {
                case ArgumentDirection::In:
                    if (!rvalue)
                        addDiag(symbol, diag::UnusedPort);
                    break;
                case ArgumentDirection::Out:
                    if (!lvalue)
                        addDiag(symbol, diag::UndrivenPort);
                    break;
                case ArgumentDirection::InOut:
                    if (!rvalue && !lvalue)
                        addDiag(symbol, diag::UnusedPort);
                    else if (!rvalue)
                        addDiag(symbol, diag::UnusedButSetPort);
                    else if (!lvalue)
                        addDiag(symbol, diag::UndrivenPort);
                    break;
                case ArgumentDirection::Ref:
                    if (!rvalue && !lvalue)
                        addDiag(symbol, diag::UnusedPort);
                    break;
            }
            return;
        }

        if (!rvalue && !lvalue)
            addDiag(symbol, unusedCode);
        else if (!rvalue && unreadCode)
            addDiag(symbol, *unreadCode);
        else if (!lvalue && !symbol.getDeclaredType()->getInitializerSyntax() && unsetCode)
            addDiag(symbol, *unsetCode);
    }